

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O1

bool __thiscall acto::core::worker_t::process(worker_t *this)

{
  object_t *this_00;
  byte in_AL;
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined7 extraout_var;
  runtime_t *prVar5;
  undefined4 extraout_var_00;
  rep rVar6;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> msg;
  long *local_48;
  long *local_40;
  uint local_34;
  
  do {
    this_00 = this->object_;
    if (this_00 == (object_t *)0x0) {
      iVar2 = 3;
    }
    else {
      local_34 = 0;
      do {
        do {
          object_t::select_message(this_00);
          if (local_40 == (long *)0x0) {
LAB_0010823b:
            bVar1 = true;
          }
          else {
            local_48 = local_40;
            local_40 = (long *)0x0;
            (*this->slots_->_vptr_callbacks[2])(this->slots_,this_00,&local_48);
            if (local_48 != (long *)0x0) {
              (**(code **)(*local_48 + 8))();
            }
            local_48 = (long *)0x0;
            if (((this_00->field_0x60 & 2) == 0) &&
               (lVar4 = std::chrono::_V2::steady_clock::now(),
               (this->time_slice_).__r < lVar4 - (this->start_).__d.__r)) goto LAB_0010823b;
            bVar1 = false;
          }
          if (local_40 != (long *)0x0) {
            (**(code **)(*local_40 + 8))();
          }
        } while (!bVar1);
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this_00->cs);
        if (iVar2 != 0) {
          std::__throw_system_error(iVar2);
        }
        if ((this_00->field_0x60 & 4) == 0) {
          if ((this_00->field_0x60 & 2) == 0) {
            bVar1 = object_t::has_messages(this_00);
            if (bVar1) {
              iVar2 = 5;
              (*this->slots_->_vptr_callbacks[5])(this->slots_,this_00);
            }
            else {
              this_00->field_0x60 = this_00->field_0x60 & 0xf7;
              iVar2 = 5;
            }
          }
          else {
            in_AL = 1;
            iVar2 = 1;
          }
        }
        else {
          bVar1 = object_t::has_messages(this_00);
          if (bVar1) {
            (this->time_slice_).__r = 0x7fffffffffffffff;
            iVar2 = 4;
          }
          else {
            this_00->field_0x60 = this_00->field_0x60 & 0xf7;
            iVar2 = 5;
            local_34 = (uint)CONCAT71(extraout_var,1);
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&this_00->cs);
      } while (iVar2 == 4);
      if (iVar2 == 5) {
        if ((local_34 & 1) != 0) {
          (*this->slots_->_vptr_callbacks[3])(this->slots_,this_00);
        }
        prVar5 = runtime_t::instance();
        runtime_t::release(prVar5,this_00);
        iVar3 = (*this->slots_->_vptr_callbacks[6])();
        this->object_ = (object_t *)CONCAT44(extraout_var_00,iVar3);
        iVar2 = 0;
        if ((object_t *)CONCAT44(extraout_var_00,iVar3) == (object_t *)0x0) {
          iVar2 = 1;
          in_AL = 0;
        }
        else {
          rVar6 = std::chrono::_V2::steady_clock::now();
          (this->start_).__d.__r = rVar6;
          prVar5 = runtime_t::instance();
          runtime_t::acquire(prVar5,this->object_);
        }
      }
    }
    if (iVar2 != 0) {
      if (iVar2 != 1) {
        in_AL = 1;
      }
      return (bool)(in_AL & 1);
    }
  } while( true );
}

Assistant:

bool worker_t::process() {
  while (object_t* const obj = object_) {
    bool need_delete = false;

    while (true) {
      // Handle a message.
      if (auto msg = obj->select_message()) {
        slots_->handle_message(obj, std::move(msg));
        // Continue processing messages if the object is bound to the thread or
        // the time slice has not been elapsed yet.
        if (obj->exclusive ||
            time_slice_ >= (std::chrono::steady_clock::now() - start_))
        {
          continue;
        }
      }

      // There are no messages in the object's mailbox or
      // the time slice was elapsed.
      std::lock_guard<std::mutex> g(obj->cs);

      if (obj->deleting) {
        // Drain the object's mailbox if it in the deleting state.
        if (obj->has_messages()) {
          time_slice_ = std::chrono::steady_clock::duration::max();
          continue;
        }

        need_delete = true;
        obj->scheduled = false;
      } else if (obj->exclusive) {
        // Just wait for new messages if the object
        // exclusively bound to the thread.
        return true;
      } else if (obj->has_messages()) {
        // Return object to the shared queue.
        slots_->push_object(obj);
      } else {
        obj->scheduled = false;
      }

      break;
    }

    if (need_delete) {
      slots_->push_delete(obj);
    }
    // Release current object.
    runtime_t::instance()->release(obj);

    // Retrieve next object from the shared queue.
    if ((object_ = slots_->pop_object())) {
      start_ = std::chrono::steady_clock::now();
      runtime_t::instance()->acquire(object_);
    } else {
      // Nothing to do.
      // Put itself to the idle list.
      return false;
    }
  }

  return true;
}